

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::timerEvent(QAbstractItemView *this,QTimerEvent *event)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  QAbstractItemViewPrivate *pQVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QModelIndex current;
  QModelIndex *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QAbstractItemView *in_stack_ffffffffffffff48;
  uint7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined4 in_stack_ffffffffffffff78;
  QPersistentModelIndex local_68 [5];
  QAbstractItemView *in_stack_ffffffffffffffc0;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QAbstractItemView *)0x8088e5);
  iVar2 = QTimerEvent::timerId((QTimerEvent *)0x8088f4);
  iVar3 = QBasicTimer::timerId((QBasicTimer *)0x808909);
  if (iVar2 == iVar3) {
    QAbstractItemViewPrivate::fetchMore
              ((QAbstractItemViewPrivate *)CONCAT44(iVar2,in_stack_ffffffffffffff78));
  }
  else {
    iVar2 = QTimerEvent::timerId((QTimerEvent *)0x80892c);
    iVar3 = QBasicTimer::timerId((QBasicTimer *)0x808941);
    if (iVar2 == iVar3) {
      (**(code **)(*in_RDI + 0x210))();
    }
    else {
      iVar2 = QTimerEvent::timerId((QTimerEvent *)0x808968);
      iVar3 = QBasicTimer::timerId((QBasicTimer *)0x80897d);
      if (iVar2 == iVar3) {
        doAutoScroll(in_stack_ffffffffffffffc0);
      }
      else {
        iVar2 = QTimerEvent::timerId((QTimerEvent *)0x8089a0);
        iVar3 = QBasicTimer::timerId((QBasicTimer *)0x8089b5);
        if (iVar2 == iVar3) {
          QAbstractItemViewPrivate::updateDirtyRegion
                    ((QAbstractItemViewPrivate *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
        }
        else {
          iVar2 = QTimerEvent::timerId((QTimerEvent *)0x8089d8);
          iVar3 = QBasicTimer::timerId((QBasicTimer *)0x8089ed);
          if (iVar2 == iVar3) {
            QBasicTimer::stop();
            currentIndex((QAbstractItemView *)
                         CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
            edit(in_stack_ffffffffffffff48,
                 (QModelIndex *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          }
          else {
            iVar2 = QTimerEvent::timerId((QTimerEvent *)0x808a3b);
            iVar3 = QBasicTimer::timerId((QBasicTimer *)0x808a50);
            if (iVar2 == iVar3) {
              QBasicTimer::stop();
              bVar1 = QWidget::isVisible((QWidget *)0x808a79);
              if (bVar1) {
                QAbstractItemViewPrivate::interruptDelayedItemsLayout
                          ((QAbstractItemViewPrivate *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
                (**(code **)(*in_RDI + 0x220))();
                local_38 = &DAT_aaaaaaaaaaaaaaaa;
                local_30 = &DAT_aaaaaaaaaaaaaaaa;
                local_28 = &DAT_aaaaaaaaaaaaaaaa;
                currentIndex((QAbstractItemView *)
                             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
                bVar1 = QModelIndex::isValid
                                  ((QModelIndex *)
                                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
                if ((bVar1) && (pQVar5->state == EditingState)) {
                  (**(code **)(*in_RDI + 0x1e8))(in_RDI,&local_38,0);
                }
              }
            }
            else {
              iVar2 = QTimerEvent::timerId((QTimerEvent *)0x808b23);
              iVar3 = QBasicTimer::timerId((QBasicTimer *)0x808b38);
              if (iVar2 == iVar3) {
                QBasicTimer::stop();
                uVar4 = QPersistentModelIndex::isValid();
                bVar1 = false;
                if ((uVar4 & 1) != 0) {
                  currentIndex((QAbstractItemView *)(ulong)in_stack_ffffffffffffff50);
                  bVar1 = ::operator==((QPersistentModelIndex *)
                                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                                       ,in_stack_ffffffffffffff38);
                }
                if (bVar1 != false) {
                  QPersistentModelIndex::operator_cast_to_QModelIndex(local_68);
                  (**(code **)(*in_RDI + 0x1e8))(in_RDI,local_68,0);
                }
              }
              else {
                iVar2 = QTimerEvent::timerId((QTimerEvent *)0x808bea);
                iVar3 = QBasicTimer::timerId((QBasicTimer *)0x808bff);
                if (iVar2 == iVar3) {
                  QBasicTimer::stop();
                }
              }
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::timerEvent(QTimerEvent *event)
{
    Q_D(QAbstractItemView);
    if (event->timerId() == d->fetchMoreTimer.timerId())
        d->fetchMore();
    else if (event->timerId() == d->delayedReset.timerId())
        reset();
    else if (event->timerId() == d->autoScrollTimer.timerId())
        doAutoScroll();
    else if (event->timerId() == d->updateTimer.timerId())
        d->updateDirtyRegion();
    else if (event->timerId() == d->delayedEditing.timerId()) {
        d->delayedEditing.stop();
        edit(currentIndex());
    } else if (event->timerId() == d->delayedLayout.timerId()) {
        d->delayedLayout.stop();
        if (isVisible()) {
            d->interruptDelayedItemsLayout();
            doItemsLayout();
            const QModelIndex current = currentIndex();
            if (current.isValid() && d->state == QAbstractItemView::EditingState)
                scrollTo(current);
        }
    } else if (event->timerId() == d->delayedAutoScroll.timerId()) {
        d->delayedAutoScroll.stop();
        //end of the timer: if the current item is still the same as the one when the mouse press occurred
        //we only get here if there was no double click
        if (d->pressedIndex.isValid() && d->pressedIndex == currentIndex())
            scrollTo(d->pressedIndex);
    } else if (event->timerId() == d->pressClosedEditorWatcher.timerId()) {
        d->pressClosedEditorWatcher.stop();
    }
}